

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::utp_stream::
async_write_some<boost::asio::const_buffer,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux___ed_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
          (utp_stream *this,const_buffer *buffers,write_op<_113276cb_> *handler)

{
  io_context *piVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  _Bind_result<_b4a6085a_> local_90;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    boost::asio::detail::write_op<$113276cb$>::write_op(&local_90._M_f,handler);
    local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x6b;
    boost::asio::
    post<boost::asio::io_context,std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtor___aceholder<1>))(boost::system::error_code_const&)>>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,(_Bind_result<_37405971_> *)&local_90,(type *)0x0);
  }
  else if ((this->m_write_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
    bVar3 = check_fin_sent(this);
    if (bVar3) {
      piVar1 = this->m_io_service;
      boost::asio::detail::write_op<$113276cb$>::write_op(&local_90._M_f,handler);
      local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<1UL,_unsigned_long,_false>)0;
      local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x20;
      boost::asio::
      post<boost::asio::io_context,std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtor___aceholder<1>))(boost::system::error_code_const&)>>(boost::asio::error::basic_errors,unsigned_long)>>
                (piVar1,(_Bind_result<_37405971_> *)&local_90,(type *)0x0);
    }
    else {
      lVar5 = 0;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 0x10) {
        lVar2 = *(long *)((long)&buffers->size_ + lVar4);
        if (lVar2 != 0) {
          add_write_buffer(this,*(void **)((long)&buffers->data_ + lVar4),(int)lVar2);
          lVar5 = lVar5 + *(long *)((long)&buffers->size_ + lVar4);
        }
      }
      if (lVar5 != 0) {
        ::std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                  ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                   &this->m_write_handler,handler);
        issue_write(this);
        return;
      }
      piVar1 = this->m_io_service;
      boost::asio::detail::write_op<$113276cb$>::write_op(&local_90._M_f,handler);
      local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (_Head_base<1UL,_unsigned_long,_false>)0;
      local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0;
      local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.failed_ = false;
      local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
      super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      boost::asio::
      post<boost::asio::io_context,std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtor___td::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code,unsigned_long)>>
                (piVar1,&local_90,(type *)0x0);
    }
  }
  else {
    piVar1 = this->m_io_service;
    boost::asio::detail::write_op<$113276cb$>::write_op(&local_90._M_f,handler);
    local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    local_90._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x5f;
    boost::asio::
    post<boost::asio::io_context,std::_Bind_result<void,boost::asio::detail::write_op<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtor___aceholder<1>))(boost::system::error_code_const&)>>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,(_Bind_result<_37405971_> *)&local_90,(type *)0x0);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_90._M_f.handler_._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
                     .
                     super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>
             + 8));
  return;
}

Assistant:

void async_write_some(Const_Buffers const& buffers, Handler handler)
	{
		if (m_impl == nullptr)
		{
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_write_handler);
		if (m_write_handler)
		{
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}

		if (check_fin_sent())
		{
			// we can't send more data after closing the socket
			post(m_io_service, std::bind<void>(std::move(handler)
				, boost::asio::error::broken_pipe, std::size_t(0)));
			return;
		}

		std::size_t bytes_added = 0;
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_write_buffer(i->data(), int(i->size()));
			bytes_added += i->size();
		}
		if (bytes_added == 0)
		{
			// if we're writing 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			post(m_io_service, std::bind<void>(std::move(handler), error_code(), std::size_t(0)));
			return;
		}
		m_write_handler = std::move(handler);
		issue_write();
	}